

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O0

void copy_and_encode(lzma_delta_coder *coder,uint8_t *in,uint8_t *out,size_t size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  size_t sVar4;
  ulong uStack_38;
  uint8_t tmp;
  size_t i;
  size_t distance;
  size_t size_local;
  uint8_t *out_local;
  uint8_t *in_local;
  lzma_delta_coder *coder_local;
  
  sVar4 = coder->distance;
  for (uStack_38 = 0; uStack_38 < size; uStack_38 = uStack_38 + 1) {
    uVar1 = coder->history[sVar4 + coder->pos & 0xff];
    uVar2 = in[uStack_38];
    bVar3 = coder->pos;
    coder->pos = bVar3 - 1;
    coder->history[(int)(uint)bVar3] = uVar2;
    out[uStack_38] = in[uStack_38] - uVar1;
  }
  return;
}

Assistant:

static void
copy_and_encode(lzma_delta_coder *coder,
		const uint8_t *restrict in, uint8_t *restrict out, size_t size)
{
	const size_t distance = coder->distance;

	for (size_t i = 0; i < size; ++i) {
		const uint8_t tmp = coder->history[
				(distance + coder->pos) & 0xFF];
		coder->history[coder->pos-- & 0xFF] = in[i];
		out[i] = in[i] - tmp;
	}
}